

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  PyTypeObject *pPVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  handle *handle;
  long *plVar6;
  undefined8 *puVar7;
  char *pcVar8;
  long *plVar9;
  pointer *ppcVar10;
  ulong uVar11;
  PyObject *pPVar12;
  size_type *psVar13;
  pointer pcVar14;
  undefined8 uVar15;
  string *in_RDI;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  handle local_168;
  handle local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  string *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  error_scope scope;
  PyObject local_e0;
  size_type *local_d0;
  string __str;
  long local_a0;
  undefined8 uStack_98;
  pointer *local_90;
  long local_88;
  pointer local_80;
  long lStack_78;
  undefined1 local_70 [24];
  handle hStack_58;
  _Alloc_hider local_50;
  size_type __dnew;
  undefined8 local_40;
  undefined8 uStack_38;
  
  lVar5 = PyErr_Occurred();
  if (lVar5 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    local_50._M_p = (pointer)0x1f;
    pcVar8 = (char *)std::__cxx11::string::_M_create
                               ((ulong *)in_RDI,(ulong)&stack0xffffffffffffffb0);
    (in_RDI->_M_dataplus)._M_p = pcVar8;
    (in_RDI->field_2)._M_allocated_capacity = (size_type)local_50._M_p;
    builtin_strncpy(pcVar8,"Unknown internal error occurred",0x1f);
    in_RDI->_M_string_length = (size_type)local_50._M_p;
    local_50._M_p[(long)(in_RDI->_M_dataplus)._M_p] = '\0';
  }
  else {
    PyErr_Fetch(local_108,&scope,&scope.value);
    local_158 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)local_158;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    local_130 = in_RDI;
    if (local_108 != (undefined1  [8])0x0) {
      local_70._8_8_ = local_108;
      local_70._16_8_ = "__name__";
      hStack_58.m_ptr = (PyObject *)0x0;
      handle = &accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_70)->
                super_handle;
      cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffb0,handle);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_50._M_p);
      if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(local_50._M_p,local_40 + 1);
      }
      object::~object((object *)&hStack_58);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (scope.type != (PyObject *)0x0) {
      local_70._0_8_ = PyObject_Str();
      str::operator_cast_to_string((string *)&stack0xffffffffffffffb0,(str *)local_70);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_50._M_p);
      if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(local_50._M_p,local_40 + 1);
      }
      object::~object((object *)local_70);
    }
    PyErr_NormalizeException(local_108,&scope,&scope.value);
    if (scope.value != (PyObject *)0x0) {
      PyException_SetTraceback(scope.type);
    }
    if (scope.value != (PyObject *)0x0) {
      do {
        pPVar12 = scope.value;
        scope.value = (PyObject *)pPVar12[1].ob_refcnt;
      } while (scope.value != (PyObject *)0x0);
      pPVar1 = pPVar12[1].ob_type;
      std::__cxx11::string::append((char *)in_RDI);
      for (; pPVar1 != (PyTypeObject *)0x0; pPVar1 = (PyTypeObject *)pPVar1->tp_name) {
        uVar3 = PyFrame_GetLineNumber(pPVar1);
        local_168.m_ptr = *(PyObject **)(pPVar1->tp_basicsize + 0x68);
        cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_188,&local_168);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x118d4e);
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_140 = *plVar9;
          lStack_138 = plVar6[3];
          local_150 = &local_140;
        }
        else {
          local_140 = *plVar9;
          local_150 = (long *)*plVar6;
        }
        local_148 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
        ppcVar10 = (pointer *)(plVar6 + 2);
        if ((pointer *)*plVar6 == ppcVar10) {
          local_80 = *ppcVar10;
          lStack_78 = plVar6[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *ppcVar10;
          local_90 = (pointer *)*plVar6;
        }
        local_88 = plVar6[1];
        *plVar6 = (long)ppcVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        __val = -uVar3;
        if (0 < (int)uVar3) {
          __val = uVar3;
        }
        __len = 1;
        if (9 < __val) {
          uVar11 = (ulong)__val;
          uVar2 = 4;
          do {
            __len = uVar2;
            uVar4 = (uint)uVar11;
            if (uVar4 < 100) {
              __len = __len - 2;
              goto LAB_00108bc4;
            }
            if (uVar4 < 1000) {
              __len = __len - 1;
              goto LAB_00108bc4;
            }
            if (uVar4 < 10000) goto LAB_00108bc4;
            uVar11 = uVar11 / 10000;
            uVar2 = __len + 4;
          } while (99999 < uVar4);
          __len = __len + 1;
        }
LAB_00108bc4:
        local_d0 = &__str._M_string_length;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_d0,(char)__len - (char)((int)uVar3 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_d0),__len,__val);
        in_RDI = local_130;
        pcVar14 = (pointer)0xf;
        if (local_90 != &local_80) {
          pcVar14 = local_80;
        }
        if (pcVar14 < __str._M_dataplus._M_p + local_88) {
          pcVar14 = (pointer)0xf;
          if (local_d0 != &__str._M_string_length) {
            pcVar14 = (pointer)__str._M_string_length;
          }
          if (pcVar14 < __str._M_dataplus._M_p + local_88) goto LAB_00108c5c;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_00108c5c:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0);
        }
        __str.field_2._8_8_ = &local_a0;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_a0 = *plVar6;
          uStack_98 = puVar7[3];
        }
        else {
          local_a0 = *plVar6;
          __str.field_2._8_8_ = (long *)*puVar7;
        }
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
        scope.trace = &local_e0;
        pPVar12 = (PyObject *)(plVar6 + 2);
        if ((PyObject *)*plVar6 == pPVar12) {
          local_e0.ob_refcnt = pPVar12->ob_refcnt;
          local_e0.ob_type = (PyTypeObject *)plVar6[3];
        }
        else {
          local_e0.ob_refcnt = pPVar12->ob_refcnt;
          scope.trace = (PyObject *)*plVar6;
        }
        lVar5 = plVar6[1];
        *plVar6 = (long)pPVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        local_160.m_ptr = *(PyObject **)(pPVar1->tp_basicsize + 0x70);
        cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_128,&local_160);
        uVar11 = 0xf;
        if (scope.trace != &local_e0) {
          uVar11 = local_e0.ob_refcnt;
        }
        if (uVar11 < local_128._M_string_length + lVar5) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            uVar15 = local_128.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_128._M_string_length + lVar5) goto LAB_00108daf;
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_128,0,(char *)0x0,(ulong)scope.trace);
        }
        else {
LAB_00108daf:
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&scope.trace,(ulong)local_128._M_dataplus._M_p);
        }
        local_70._0_8_ = local_70 + 0x10;
        pPVar12 = (PyObject *)(plVar6 + 2);
        if ((PyObject *)*plVar6 == pPVar12) {
          local_70._16_8_ = pPVar12->ob_refcnt;
          hStack_58.m_ptr = (PyObject *)plVar6[3];
        }
        else {
          local_70._16_8_ = pPVar12->ob_refcnt;
          local_70._0_8_ = (PyObject *)*plVar6;
        }
        local_70._8_8_ = plVar6[1];
        *plVar6 = (long)pPVar12;
        plVar6[1] = 0;
        *(undefined1 *)&pPVar12->ob_refcnt = 0;
        plVar6 = (long *)std::__cxx11::string::append(local_70);
        local_50._M_p = (pointer)&stack0xffffffffffffffc0;
        psVar13 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar13) {
          local_40 = *psVar13;
          uStack_38 = plVar6[3];
        }
        else {
          local_40 = *psVar13;
          local_50._M_p = (pointer)*plVar6;
        }
        __dnew = plVar6[1];
        *plVar6 = (long)psVar13;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_50._M_p);
        if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
          operator_delete(local_50._M_p,local_40 + 1);
        }
        if ((PyObject *)local_70._0_8_ != (PyObject *)(local_70 + 0x10)) {
          operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (scope.trace != &local_e0) {
          operator_delete(scope.trace,local_e0.ob_refcnt + 1);
        }
        if ((long *)__str.field_2._8_8_ != &local_a0) {
          operator_delete((void *)__str.field_2._8_8_,local_a0 + 1);
        }
        if (local_d0 != &__str._M_string_length) {
          operator_delete(local_d0,__str._M_string_length + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,(ulong)(local_80 + 1));
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
    }
    error_scope::~error_scope((error_scope *)local_108);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
    }
#endif

    return errorString;
}